

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void google::protobuf::internal::RegisterAllTypesInternal(Metadata *file_level_metadata,int size)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)size;
  if (size < 1) {
    uVar2 = uVar3;
  }
  for (; uVar2 * 0x10 != uVar3; uVar3 = uVar3 + 0x10) {
    lVar1 = *(long *)((long)&file_level_metadata->reflection + uVar3);
    if (lVar1 != 0) {
      MessageFactory::InternalRegisterGeneratedMessage
                (*(Descriptor **)((long)&file_level_metadata->descriptor + uVar3),
                 *(Message **)(lVar1 + 0x10));
    }
  }
  return;
}

Assistant:

void RegisterAllTypesInternal(const Metadata* file_level_metadata, int size) {
  for (int i = 0; i < size; i++) {
    const GeneratedMessageReflection* reflection =
        static_cast<const GeneratedMessageReflection*>(
           file_level_metadata[i].reflection);
    if (reflection) {
      // It's not a map type
      ::google::protobuf::MessageFactory::InternalRegisterGeneratedMessage(
          file_level_metadata[i].descriptor,
          reflection->schema_.default_instance_);
    }
  }
}